

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O3

RC __thiscall QL_Node::IndexToOffset(QL_Node *this,int index,int *offset,int *length)

{
  int *piVar1;
  AttrCatEntry *pAVar2;
  int iVar3;
  long lVar4;
  
  *offset = 0;
  if (0 < this->attrsInRecSize) {
    piVar1 = this->attrsInRec;
    pAVar2 = this->qlm->attrEntries;
    iVar3 = 0;
    lVar4 = 0;
    do {
      if (piVar1[lVar4] == index) {
        *length = pAVar2[index].attrLength;
        return 0;
      }
      iVar3 = iVar3 + pAVar2[piVar1[lVar4]].attrLength;
      *offset = iVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->attrsInRecSize);
  }
  return 0x194;
}

Assistant:

RC QL_Node::IndexToOffset(int index, int &offset, int &length){
  offset = 0;
  for(int i=0; i < attrsInRecSize; i++){
    if(attrsInRec[i] == index){
      length = qlm.attrEntries[attrsInRec[i]].attrLength;
      return (0);
    }
    offset += qlm.attrEntries[attrsInRec[i]].attrLength;
  }
  return (QL_ATTRNOTFOUND);
}